

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O1

void __thiscall tst_qpromise_convert::fulfillTAsU(tst_qpromise_convert *this)

{
  QSharedData *pQVar1;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **pppVar2;
  qsizetype *pqVar3;
  type ppVar4;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *pfVar5;
  uint uVar6;
  long lVar7;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_> *ppVar8;
  _Manager_type p_Var9;
  code *pcVar10;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *ppVar11;
  _func_int *p_Var12;
  Data *pDVar13;
  int *piVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
  *pPVar17;
  type ppVar18;
  long lVar19;
  _func_int **pp_Var20;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar21;
  PromiseResolver<double> PVar22;
  PromiseResolver<void> PVar23;
  PromiseResolver<(anonymous_namespace)::Enum1> PVar24;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> QVar25;
  PromiseResolver<int> PVar26;
  char cVar27;
  bool bVar28;
  int iVar29;
  PromiseData<(anonymous_namespace)::Enum1> *pPVar30;
  long *plVar31;
  PromiseData<(anonymous_namespace)::Enum1> *this_00;
  QSharedData *pQVar32;
  PromiseDataBase<void,_void_()> *pPVar33;
  char *pcVar34;
  char *pcVar35;
  PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
  *this_01;
  undefined8 *puVar36;
  Data *pDVar37;
  Data *pDVar38;
  QObject *pQVar39;
  PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)> *this_02;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> QVar40;
  Data *pDVar41;
  Data *pDVar42;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
  *old;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
  *old_00;
  type ppVar43;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar44;
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
  *pPVar45;
  long lVar46;
  type ppVar47;
  int iVar48;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar49;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  QVar50;
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
  *pPVar51;
  type ppVar52;
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
  *pPVar53;
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *__p;
  QSharedData *pQVar54;
  PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
  *pPVar55;
  type ppVar56;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  QByteArrayView QVar61;
  QStringView QVar62;
  QStringView QVar63;
  QStringView QVar64;
  QStringView QVar65;
  QStringView QVar66;
  QStringView QVar67;
  pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> local_328;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
  local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_2b8;
  PromiseData<(anonymous_namespace)::Enum1> *pPStack_2b0;
  undefined1 local_2a8 [16];
  PromiseResolver<double> resolver;
  PromiseResolver<void> resolver_5;
  type ppStack_260;
  _func_int **local_258 [2];
  PromiseResolver<(anonymous_namespace)::Enum1> resolver_2;
  undefined8 uStack_240;
  QPromise<QString> p_3;
  QWriteLocker lock_2;
  QString local_1e8;
  PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
  *local_1d0;
  PromiseResolver<void> resolver_8;
  PromiseResolver<int> resolver_1;
  undefined1 local_1a8 [32];
  QWriteLocker lock;
  QWriteLocker lock_1;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> local_50;
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
  *local_48;
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
  *local_40;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_38;
  
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &DAT_404510a3d70a3d71;
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f0b0;
  pPVar30 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->super_QSharedData = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_settled = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f2b0;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<int,_void_(const_int_&)> *)
              &pPVar30->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )->m_lock,0);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->m_settled = false;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014f238;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar30->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &pPVar30->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)&PTR__QPromiseBase_0014f200;
  local_328.first.wp.value = (QObject *)pPVar30;
  local_2e8._8_8_ = pPVar30;
  QtPromisePrivate::PromiseResolver<double>::PromiseResolver
            (&resolver,(QPromise<double> *)&local_328);
  local_328.first.wp.d = (Data *)&PTR__QPromiseBase_0014f0b0;
  if ((PromiseData<(anonymous_namespace)::Enum1> *)local_328.first.wp.value !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)&(local_328.first.wp.value)->field_0x0)
               ->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<(anonymous_namespace)::Enum1> *)local_328.first.wp.value !=
        (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)&(local_328.first.wp.value)->field_0x0)->
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar22.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
          )resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseResolver<double>::resolve<double>
            ((PromiseResolver<double> *)&resolver_2,(double *)&resolver_1);
  if (PVar22.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar22.m_d.d = *(int *)PVar22.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar22.m_d.d == 0) {
      operator_delete((void *)PVar22.m_d.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f200;
  QtPromise::QPromise<double>::convert<int>((QPromise<double> *)&p);
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f0b0;
  if ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
        (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->_vptr_PromiseDataBase[1])();
    }
  }
  local_328.first.wp.d = (Data *)CONCAT44(local_328.first.wp.d._4_4_,0xffffffff);
  iVar29 = waitForValue<int>(&p,(int *)&local_328);
  cVar27 = QTest::qCompare(iVar29,0x2a,"waitForValue(p, -1)","42",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x4f);
  QVar21 = p.super_QPromiseBase<int>.m_d;
  if (cVar27 == '\0') {
    cVar27 = '\0';
  }
  else {
    bVar28 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       (&(p.super_QPromiseBase<int>.m_d.d)->
                         super_PromiseDataBase<int,_void_(const_int_&)>);
    cVar27 = QTest::qVerify((bool)(~bVar28 &
                                  ((QVar21.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                                  m_error.m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x50);
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014f0e0;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar32 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (cVar27 == '\0') {
    return;
  }
  lock.q_val._0_4_ = 1;
  QtPromise::resolve<(anonymous_namespace)::Enum1>((QtPromise *)&resolver_2,(Enum1 *)&lock);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<int_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<int_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_0014f0e0;
  pPVar30 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->super_QSharedData = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_settled = 0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f428;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<int,_void_(const_int_&)> *)
              &pPVar30->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )->m_lock,0);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->m_settled = false;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014f3c0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar30->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &pPVar30->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f388;
  local_2e8._8_8_ = pPVar30;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)local_2e8);
  local_2f0.d = (Data *)&PTR__QPromiseBase_0014f388;
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f0e0;
  if ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
        (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->_vptr_PromiseDataBase[1])();
    }
  }
  PVar26.m_d.d = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.value = (QObject *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  pfVar5 = &local_328.second;
  std::function<int_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<int_(const_(anonymous_namespace)::Enum1_&)> *)pfVar5,
             (function<int_(const_(anonymous_namespace)::Enum1_&)> *)&p);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  plVar31 = (long *)operator_new(0x30);
  *plVar31 = (long)local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  plVar31[1] = (long)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::function<int_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<int_(const_(anonymous_namespace)::Enum1_&)> *)(plVar31 + 2),
             (function<int_(const_(anonymous_namespace)::Enum1_&)> *)pfVar5);
  pcStack_a0 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_b8._M_unused._M_object = plVar31;
  if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(pfVar5,pfVar5,3);
  }
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.value != (Data *)0x0)) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.d != (Data *)0x0)) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_240,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (PVar26.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar26.m_d.d = *(int *)PVar26.m_d.d + 1;
    UNLOCK();
  }
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_158._M_unused._M_object = operator_new(8);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_158._M_unused._0_8_)->d = (Data *)PVar26.m_d.d;
  if (PVar26.m_d.d == (Data *)0x0) {
    pcStack_140 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar26.m_d.d = *(int *)PVar26.m_d.d + 1;
    UNLOCK();
    pcStack_140 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
    LOCK();
    *(int *)PVar26.m_d.d = *(int *)PVar26.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar26.m_d.d == 0) {
      operator_delete((void *)PVar26.m_d.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_240,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if (PVar26.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar26.m_d.d = *(int *)PVar26.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar26.m_d.d == 0) {
      operator_delete((void *)PVar26.m_d.d,0x10);
    }
  }
  if (PVar26.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar26.m_d.d = *(int *)PVar26.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar26.m_d.d == 0) {
      operator_delete((void *)PVar26.m_d.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)local_2f0.d;
  bVar28 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)uStack_240);
  if (!bVar28) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uStack_240);
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )&PTR__QPromiseBase_0014e2e0;
  LOCK();
  pQVar32 = (QSharedData *)(uStack_240 + 8);
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     ((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
      uStack_240 !=
      (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)> *)
      0x0)) {
    (**(code **)(*(long *)uStack_240 + 8))();
  }
  local_328.first.wp.d = (Data *)CONCAT44(local_328.first.wp.d._4_4_,0xffffffff);
  iVar29 = waitForValue<int>((QPromise<int> *)&resolver,(int *)&local_328);
  cVar27 = QTest::qCompare(iVar29,1,"waitForValue(p, -1)","1",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x59);
  if (cVar27 == '\0') {
    cVar27 = '\0';
  }
  else {
    bVar28 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar30);
    cVar27 = QTest::qVerify((bool)(~bVar28 &
                                  (((PromiseDataBase<int,_void_(const_int_&)> *)
                                   &pPVar30->
                                    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                                   )->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x5a);
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_0014f0e0;
  if (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &pPVar30->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)
        &pPVar30->
         super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
        )->_vptr_PromiseDataBase[1])();
    }
  }
  if (cVar27 == '\0') {
    return;
  }
  resolver_1.m_d.d._0_4_ = 1;
  QtPromise::resolve<int>((QtPromise *)&resolver,(int *)&resolver_1);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<(anonymous_namespace)::Enum1_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<(anonymous_namespace)::Enum1_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  this_00 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &this_00->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &this_00->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->super_QSharedData = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  (this_00->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &this_00->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &this_00->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_settled = 0;
  (this_00->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &this_00->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014e610;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<int,_void_(const_int_&)> *)
              &this_00->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )->m_lock,0);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &this_00->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->m_settled = false;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &this_00->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014e5a8;
  (this_00->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &this_00->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &this_00->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &this_00->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  local_2e8._0_8_ = &PTR__QPromiseBase_0014e570;
  local_2e8._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::PromiseResolver
            (&resolver_2,(QPromise<(anonymous_namespace)::Enum1> *)local_2e8);
  local_2e8._0_8_ = &PTR__QPromiseBase_0014e2e0;
  if ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar54 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->super_QSharedData;
    (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
        (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->_vptr_PromiseDataBase[1])();
    }
  }
  PVar24.m_d.d = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.value = (QObject *)resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  pfVar5 = &local_328.second;
  local_2f0 = resolver_2.m_d.d;
  std::function<(anonymous_namespace)::Enum1_(const_int_&)>::function
            ((function<(anonymous_namespace)::Enum1_(const_int_&)> *)pfVar5,
             (function<(anonymous_namespace)::Enum1_(const_int_&)> *)&p);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  plVar31 = (long *)operator_new(0x30);
  *plVar31 = (long)local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  plVar31[1] = (long)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Enum1_(const_int_&)>::function
            ((function<(anonymous_namespace)::Enum1_(const_int_&)> *)(plVar31 + 2),
             (function<(anonymous_namespace)::Enum1_(const_int_&)> *)pfVar5);
  pcStack_80 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_98._M_unused._M_object = plVar31;
  if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(pfVar5,pfVar5,3);
  }
  QVar50.d = local_2f0.d;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.value != (Data *)0x0)) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.d != (Data *)0x0)) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar30,
             (function<void_(const_int_&)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (PVar24.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar24.m_d.d = *(int *)PVar24.m_d.d + 1;
    UNLOCK();
  }
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_138._M_unused._M_object = operator_new(8);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
    *)local_138._M_unused._0_8_)->d = (Data *)PVar24.m_d.d;
  if (PVar24.m_d.d == (Data *)0x0) {
    pcStack_120 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar24.m_d.d = *(int *)PVar24.m_d.d + 1;
    UNLOCK();
    pcStack_120 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
    LOCK();
    *(int *)PVar24.m_d.d = *(int *)PVar24.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar24.m_d.d == 0) {
      operator_delete((void *)PVar24.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar30,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  if (PVar24.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar24.m_d.d = *(int *)PVar24.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar24.m_d.d == 0) {
      operator_delete((void *)PVar24.m_d.d,0x10);
    }
  }
  if (QVar50.d != (Data *)0x0) {
    LOCK();
    ((QVar50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar50.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  bVar28 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar30);
  if (!bVar28) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar30);
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_0014f0e0;
  LOCK();
  pQVar54 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar30->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)
      &pPVar30->
       super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
      )->_vptr_PromiseDataBase[1])();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       ((ulong)resolver.m_d.d & 0xffffffff00000000);
  pPVar33 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar33->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar33->super_QSharedData = 0;
  (pPVar33->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar33->m_catchers).d.size = 0;
  (pPVar33->m_handlers).d.size = 0;
  (pPVar33->m_catchers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&pPVar33->m_lock = 0;
  *(undefined8 *)&pPVar33->m_settled = 0;
  (pPVar33->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar33->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f570;
  QReadWriteLock::QReadWriteLock(&pPVar33->m_lock,0);
  pPVar33->m_settled = false;
  (pPVar33->m_handlers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (pPVar33->m_handlers).d.size = 0;
  (pPVar33->m_catchers).d.d = (Data *)0x0;
  (pPVar33->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar33->m_catchers).d.size = 0;
  (pPVar33->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar33->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f508;
  LOCK();
  (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar54 = &pPVar33->super_QSharedData;
  local_50.d = (Data *)&PTR__QPromiseBase_0014f4d0;
  local_328.first.wp.d = (Data *)&PTR__QPromiseBase_0014f4d0;
  local_328.first.wp.value = (QObject *)pPVar33;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&p,(QPromise<void> *)&local_328);
  local_328.first.wp.d = (Data *)&PTR__QPromiseBase_0014f170;
  if ((PromiseDataBase<void,_void_()> *)local_328.first.wp.value !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)((long)local_328.first.wp.value + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int> == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_328.first.wp.value !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*(*(_func_int ***)&(local_328.first.wp.value)->field_0x0)[1])();
    }
  }
  pp_Var20 = p.super_QPromiseBase<int>._vptr_QPromiseBase;
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
    UNLOCK();
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
    UNLOCK();
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
    UNLOCK();
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + 1;
    UNLOCK();
  }
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x18);
  *(_func_int ***)local_f8._M_unused._0_8_ = pp_Var20;
  if (pp_Var20 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + 1;
    UNLOCK();
  }
  *(_func_int ***)((long)local_f8._M_unused._0_8_ + 8) = pp_Var20;
  if (pp_Var20 == (_func_int **)0x0) {
    *(PromiseResolver<double> **)((long)local_f8._M_unused._0_8_ + 0x10) = &resolver;
    pcStack_e0 = std::
                 _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + 1;
    UNLOCK();
    *(PromiseResolver<double> **)((long)local_f8._M_unused._0_8_ + 0x10) = &resolver;
    pcStack_e0 = std::
                 _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + -1;
    UNLOCK();
    if (*(int *)pp_Var20 == 0) {
      operator_delete(pp_Var20,0x10);
    }
  }
  if (pp_Var20 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + -1;
    UNLOCK();
    if (*(int *)pp_Var20 == 0) {
      operator_delete(pp_Var20,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)this_00,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (pp_Var20 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + 1;
    UNLOCK();
  }
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(8);
  *(_func_int ***)local_118._M_unused._0_8_ = pp_Var20;
  if (pp_Var20 == (_func_int **)0x0) {
    pcStack_100 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + 1;
    UNLOCK();
    pcStack_100 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                ::_M_manager;
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + -1;
    UNLOCK();
    if (*(int *)pp_Var20 == 0) {
      operator_delete(pp_Var20,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  if (pp_Var20 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + -1;
    UNLOCK();
    if (*(int *)pp_Var20 == 0) {
      operator_delete(pp_Var20,0x10);
    }
  }
  if (pp_Var20 != (_func_int **)0x0) {
    LOCK();
    *(int *)pp_Var20 = *(int *)pp_Var20 + -1;
    UNLOCK();
    if (*(int *)pp_Var20 == 0) {
      operator_delete(pp_Var20,0x10);
    }
  }
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if ((*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) &&
       (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0)) {
      operator_delete(p.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
    }
  }
  bVar28 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)this_00);
  if (!bVar28) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)this_00);
  }
  bVar28 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar33);
  while (bVar28 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar28 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar33);
  }
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*pPVar33->_vptr_PromiseDataBase[1])(pPVar33);
  }
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*pPVar33->_vptr_PromiseDataBase[1])(pPVar33);
  }
  iVar29 = (int)resolver.m_d.d;
  iVar48 = (int)&local_328;
  QByteArray::number(iVar48,(int)resolver.m_d.d);
  pPVar33 = (PromiseDataBase<void,_void_()> *)local_328.first.wp.value;
  if ((PromiseDataBase<void,_void_()> *)local_328.first.wp.value ==
      (PromiseDataBase<void,_void_()> *)0x0) {
    pPVar33 = (PromiseDataBase<void,_void_()> *)&QByteArray::_empty;
  }
  pcVar34 = (char *)qstrdup((char *)pPVar33);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  QByteArray::number(iVar48,1);
  pPVar33 = (PromiseDataBase<void,_void_()> *)local_328.first.wp.value;
  if ((PromiseDataBase<void,_void_()> *)local_328.first.wp.value ==
      (PromiseDataBase<void,_void_()> *)0x0) {
    pPVar33 = (PromiseDataBase<void,_void_()> *)&QByteArray::_empty;
  }
  pcVar35 = (char *)qstrdup((char *)pPVar33);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  cVar27 = QTest::compare_helper
                     (iVar29 == 1,"Compared values are not the same",pcVar34,pcVar35,
                      "waitForValue(p, Enum1::Value0)","Enum1::Value1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,99);
  if (cVar27 == '\0') {
    cVar27 = '\0';
  }
  else {
    bVar28 = QtPromisePrivate::
             PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                          *)this_00);
    cVar27 = QTest::qVerify((bool)(~bVar28 &
                                  (((PromiseDataBase<int,_void_(const_int_&)> *)
                                   &this_00->
                                    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                                   )->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,100);
  }
  LOCK();
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)
      &this_00->
       super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
      )->_vptr_PromiseDataBase[1])(this_00);
  }
  if (cVar27 == '\0') {
    return;
  }
  resolver_2.m_d.d._0_4_ = 1;
  QtPromise::resolve<(anonymous_namespace)::Enum1>((QtPromise *)local_2e8,(Enum1 *)&resolver_2);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  this_01 = (PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
             *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014e838;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014e7d0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar32 = &this_01->super_QSharedData;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       operator_new(0x10);
  (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  ((Data *)resolver.m_d.d)->promise = (QPromise<double> *)0x0;
  LOCK();
  (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar36 = (undefined8 *)operator_new(0x10);
  PVar22.m_d.d = resolver.m_d.d;
  uVar15 = local_2e8._8_8_;
  puVar36[1] = this_01;
  *puVar36 = &PTR__QPromiseBase_0014e798;
  *(undefined8 **)((long)resolver.m_d.d + 8) = puVar36;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.value = (QObject *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_1d0 = this_01;
  std::function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             &local_328.second,
             (function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)&p);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  puVar36 = (undefined8 *)operator_new(0x30);
  *puVar36 = local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  puVar36[1] = local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)>::function
            ((function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             (puVar36 + 2),
             (function<(anonymous_namespace)::Enum2_(const_(anonymous_namespace)::Enum1_&)> *)
             &local_328.second);
  pcStack_60 = std::
               _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_(anonymous_namespace)::Enum1_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  local_78._M_unused._M_object = puVar36;
  if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
  }
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.value != (Data *)0x0)) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.d != (Data *)0x0)) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addHandler((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uVar15,(function<void_(const_(anonymous_namespace)::Enum1_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  uVar15 = local_2e8._8_8_;
  if (PVar22.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar22.m_d.d = *(int *)PVar22.m_d.d + 1;
    UNLOCK();
  }
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_d8._M_unused._M_object = operator_new(8);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data> *)
  local_d8._M_unused._0_8_)->d = (Data *)PVar22.m_d.d;
  if (PVar22.m_d.d == (Data *)0x0) {
    pcStack_c0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar22.m_d.d = *(int *)PVar22.m_d.d + 1;
    UNLOCK();
    pcStack_c0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar22.m_d.d = *(int *)PVar22.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar22.m_d.d == 0) {
      operator_delete((void *)PVar22.m_d.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
  addCatcher((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uVar15,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (PVar22.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar22.m_d.d = *(int *)PVar22.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar22.m_d.d == 0) {
      operator_delete((void *)PVar22.m_d.d,0x10);
    }
  }
  if (PVar22.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar22.m_d.d = *(int *)PVar22.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar22.m_d.d == 0) {
      operator_delete((void *)PVar22.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  uVar15 = local_2e8._8_8_;
  bVar28 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
           ::isPending((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                        *)local_2e8._8_8_);
  if (!bVar28) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>::
    dispatch((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              *)uVar15);
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  local_2e8._0_8_ = &PTR__QPromiseBase_0014e2e0;
  LOCK();
  pQVar54 = &((PromiseDataBase<int,_void_(const_int_&)> *)uVar15)->super_QSharedData;
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
    (**(code **)(((QWeakPointer<QObject> *)
                 &((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->
                  _vptr_PromiseDataBase)->d + 8))();
  }
  local_1e8.d.d = (Data *)((ulong)local_1e8.d.d._4_4_ << 0x20);
  pPVar33 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar33->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar33->super_QSharedData = 0;
  (pPVar33->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar33->m_catchers).d.size = 0;
  (pPVar33->m_handlers).d.size = 0;
  (pPVar33->m_catchers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&pPVar33->m_lock = 0;
  *(undefined8 *)&pPVar33->m_settled = 0;
  (pPVar33->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar33->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f570;
  QReadWriteLock::QReadWriteLock(&pPVar33->m_lock,0);
  pPVar33->m_settled = false;
  (pPVar33->m_handlers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (pPVar33->m_handlers).d.size = 0;
  (pPVar33->m_catchers).d.d = (Data *)0x0;
  (pPVar33->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar33->m_catchers).d.size = 0;
  (pPVar33->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar33->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f508;
  LOCK();
  (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar54 = &pPVar33->super_QSharedData;
  LOCK();
  (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)local_50.d;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_5,(QPromise<void> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_0014f170;
  if (pPVar33 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &pPVar33->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPVar33 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*pPVar33->_vptr_PromiseDataBase[1])();
    }
  }
  pPVar55 = local_1d0;
  QVar57 = resolver_5.m_d.d;
  if (resolver_5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
  }
  local_1a8._0_8_ = (Data *)0x0;
  local_1a8._8_8_ = (QObject *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  local_2f0.d = (Data *)resolver_5.m_d.d;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(Data **)resolver_1.m_d.d = QVar57.d;
  if (QVar57.d != (Data *)0x0) {
    LOCK();
    *(int *)QVar57.d = *(int *)QVar57.d + 1;
    UNLOCK();
  }
  ((Data *)resolver_1.m_d.d)->promise = (QPromise<int> *)QVar57.d;
  if (QVar57.d == (Data *)0x0) {
    *(Data **)((long)resolver_1.m_d.d + 0x10) = (Data *)&local_1e8;
    local_1a8._8_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_1a8._0_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
  }
  else {
    LOCK();
    *(int *)QVar57.d = *(int *)QVar57.d + 1;
    UNLOCK();
    *(Data **)((long)resolver_1.m_d.d + 0x10) = (Data *)&local_1e8;
    local_1a8._8_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_1a8._0_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Enum2_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    LOCK();
    *(int *)QVar57.d = *(int *)QVar57.d + -1;
    UNLOCK();
    if (*(int *)QVar57.d == 0) {
      operator_delete(QVar57.d,0x10);
    }
  }
  if (QVar57.d != (Data *)0x0) {
    LOCK();
    *(int *)QVar57.d = *(int *)QVar57.d + -1;
    UNLOCK();
    if (*(int *)QVar57.d == 0) {
      operator_delete(QVar57.d,0x10);
    }
  }
  lock.q_val = (quintptr)&this_01->m_lock;
  QReadWriteLock::lockForWrite();
  lock.q_val = lock.q_val | 1;
  auVar58 = QThread::currentThread();
  pDVar37 = auVar58._0_8_;
  if (pDVar37 == (Data *)0x0) {
    auVar59._8_8_ = 0;
    auVar59._0_8_ = auVar58._8_8_;
    auVar59 = auVar59 << 0x40;
  }
  else {
    auVar59 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar37);
  }
  uVar15 = local_1a8._8_8_;
  ppVar44 = auVar59._8_8_;
  pDVar38 = auVar59._0_8_;
  local_2b8.d = (Data *)0x0;
  local_2a8._0_8_ = (Data *)0x0;
  local_2a8._8_8_ = local_1a8._8_8_;
  if ((Data *)local_1a8._0_8_ != (Data *)0x0) {
    ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)local_1a8;
    local_2b8 = resolver_1.m_d.d;
    local_2a8._0_8_ = local_1a8._0_8_;
    local_1a8._0_8_ = (Data *)0x0;
    local_1a8._8_8_ = (QObject *)0x0;
  }
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
         *)(this_01->m_handlers).d.d;
  lVar7 = (this_01->m_handlers).d.size;
  if ((old == (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
               *)0x0) ||
     (uVar6 = (((QArrayData *)&old->d)->ref_)._q_value.super___atomic_base<int>._M_i,
     ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)(ulong)uVar6,
     1 < (int)uVar6)) {
LAB_0010add4:
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    local_328.second.super__Function_base._M_functor._M_unused._M_object = (Data *)0x0;
    local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
    local_328.second._M_invoker = (_Invoker_type)uVar15;
    if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
      ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)local_2a8;
      local_328.second.super__Function_base._M_functor._M_unused._M_object = local_2b8.d;
      local_328.second.super__Function_base._M_manager = (_Manager_type)local_2a8._0_8_;
      local_2a8._0_8_ = (Data *)0x0;
      local_2a8._8_8_ = (QObject *)0x0;
    }
    local_328.second.super__Function_base._M_functor._8_8_ = 0;
    local_328.first.wp.d = (Data *)pDVar38;
    local_328.first.wp.value = (QObject *)pDVar37;
    if ((old == (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                 *)0x0) ||
       (1 < (((QArrayData *)&old->d)->ref_)._q_value.super___atomic_base<int>._M_i)) {
LAB_0010ae32:
      QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
      ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
                           *)&pPVar55->m_handlers,GrowsAtEnd,(qsizetype)ppVar44,old);
    }
    else {
      ppVar8 = old->ptr;
      __p = (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             *)(this_01->m_handlers).d.ptr;
      ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
                ((long)__p - ((ulong)((long)&old->size + 7) & 0xfffffffffffffff8));
      lVar46 = (long)ppVar44 >> 4;
      old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>_>
             *)(lVar46 * 0x5555555555555555);
      if (((long)ppVar8 - lVar7) + (long)old < 1) {
        if (((long)ppVar44 < 1) ||
           (SBORROW8(lVar7 * 3,(long)ppVar8 * 2) == lVar7 * 3 + (long)ppVar8 * -2 < 0))
        goto LAB_0010ae32;
        QVar50.d = (Data *)((long)__p + lVar46 * -0x10);
        if (__p != (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                    *)0x0 && lVar7 != 0) {
          pPVar51 = (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                     *)(QVar50.d + lVar7 * 3);
          pPVar53 = __p;
          pPVar17 = pPVar51;
          if (__p < pPVar51) {
            pPVar53 = pPVar51;
            pPVar17 = __p;
          }
          resolver_2.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
                )(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
                  )QVar50.d;
          if (pPVar17 !=
              (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               *)QVar50.d) {
            lVar19 = lVar46 * -0x10;
            do {
              (((QPointer<QThread> *)
               &((PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                  *)((long)__p + lVar19))->_vptr_PromiseDataBase)->wp).d =
                   (((QPointer<QThread> *)&__p->_vptr_PromiseDataBase)->wp).d;
              *(QObject **)((long)__p + lVar19 + 8) = *(QObject **)&__p->super_QSharedData;
              (((QPointer<QThread> *)&__p->_vptr_PromiseDataBase)->wp).d = (Data *)0x0;
              *(QObject **)&__p->super_QSharedData = (QObject *)0x0;
              puVar36 = (undefined8 *)((long)__p + lVar19 + 0x10);
              *puVar36 = 0;
              puVar36[1] = 0;
              *(undefined8 *)((long)__p + lVar19 + 0x20) = 0;
              *(pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **)
               ((long)__p + lVar19 + 0x28) = (__p->m_handlers).d.ptr;
              if ((__p->m_handlers).d.d != (Data *)0x0) {
                uVar16 = *(undefined8 *)&__p->m_settled;
                *(undefined8 *)((long)__p + lVar19 + 0x10) =
                     *(undefined8 *)
                      &(((function<void_(const_double_&)> *)&__p->m_lock)->super__Function_base).
                       _M_functor;
                *(undefined8 *)((long)__p + lVar19 + 0x18) = uVar16;
                *(Data **)((long)__p + lVar19 + 0x20) = (__p->m_handlers).d.d;
                (__p->m_handlers).d.d = (Data *)0x0;
                (__p->m_handlers).d.ptr =
                     (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
              }
              pPVar45 = (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                         *)((long)__p + lVar19 + 0x30);
              __p = (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                     *)&(__p->m_handlers).d.size;
            } while (pPVar45 != pPVar17);
            resolver_2.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
                  )((long)__p + lVar46 * -2 * 8);
          }
          local_2e8._0_8_ = local_2d8;
          local_2e8._8_8_ = QVar50.d;
          local_48 = (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                      *)QVar50.d;
          local_2d8._0_8_ = resolver_2.m_d.d;
          for (; local_40 = pPVar53,
              resolver_2.m_d.d !=
              (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
               )pPVar51;
              resolver_2.m_d.d =
                   (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
                    )((long)resolver_2.m_d.d + 0x30)) {
            std::
            pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
            operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                       *)resolver_2.m_d.d,(type)__p);
            __p = (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                   *)&(__p->m_handlers).d.size;
            pPVar53 = local_40;
          }
          local_2e8._0_8_ = local_2e8 + 8;
          while (__p != pPVar53) {
            pcVar10 = (code *)__p[-1].m_catchers.d.size;
            if (pcVar10 != (code *)0x0) {
              (*pcVar10)((_Any_data *)&__p[-1].m_catchers,(_Any_data *)&__p[-1].m_catchers,
                         __destroy_functor);
            }
            __p = (PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                   *)&__p[-1].m_handlers.d.ptr;
            ppVar44 = *(pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **)__p;
            if (ppVar44 != (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0) {
              LOCK();
              *(int *)&(ppVar44->first).wp.d = *(int *)&(ppVar44->first).wp.d + -1;
              UNLOCK();
              if ((*(int *)&(ppVar44->first).wp.d == 0) &&
                 (*(pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **)__p !=
                  (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0)) {
                operator_delete(*(pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **)
                                 __p);
              }
            }
          }
          pPVar30 = *(PromiseData<(anonymous_namespace)::Enum1> **)(QArrayData *)local_2e8._0_8_;
          QVar50.d = (Data *)local_48;
          if (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_) {
            bVar28 = pPVar30 < (ulong)local_2e8._8_8_;
            do {
              *(QWeakPointer<QObject> **)(QArrayData *)local_2e8._0_8_ =
                   (QWeakPointer<QObject> *)
                   &((PromiseDataBase<int,_void_(const_int_&)> *)
                    &pPVar30->
                     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
                    )->_vptr_PromiseDataBase + ((ulong)bVar28 - 1 | 1) * 3;
              p_Var12 = *(_func_int **)(QArrayData *)local_2e8._0_8_;
              if (*(code **)(p_Var12 + 0x20) != (code *)0x0) {
                (**(code **)(p_Var12 + 0x20))(p_Var12 + 0x10,p_Var12 + 0x10,3);
              }
              piVar14 = *(int **)p_Var12;
              if (piVar14 != (int *)0x0) {
                LOCK();
                *piVar14 = *piVar14 + -1;
                UNLOCK();
                if ((*piVar14 == 0) && (*(void **)p_Var12 != (void *)0x0)) {
                  operator_delete(*(void **)p_Var12);
                }
              }
              pPVar30 = *(PromiseData<(anonymous_namespace)::Enum1> **)(QArrayData *)local_2e8._0_8_
              ;
              QVar50.d = (Data *)local_48;
            } while (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_);
          }
        }
        (this_01->m_handlers).d.ptr =
             (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)QVar50.d;
      }
    }
    local_38.d = QVar57.d;
    ppVar49 = (this_01->m_handlers).d.ptr;
    lVar46 = (this_01->m_handlers).d.size;
    ppVar44 = ppVar49 + lVar46;
    lVar19 = -(lVar46 - lVar7);
    if (lVar46 - lVar7 < 1) {
      (ppVar44->first).wp.d = local_328.first.wp.d;
      (ppVar44->first).wp.value = local_328.first.wp.value;
      local_328.first.wp.d = (Data *)0x0;
      local_328.first.wp.value = (QObject *)0x0;
      *(undefined8 *)&(ppVar44->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) = 0;
      (ppVar44->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar44->second)._M_invoker = (_Invoker_type)local_328.second._M_invoker;
      if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
        *(void **)&(ppVar44->second).super__Function_base._M_functor =
             local_328.second.super__Function_base._M_functor._M_unused._M_object;
        *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) =
             local_328.second.super__Function_base._M_functor._8_8_;
        (ppVar44->second).super__Function_base._M_manager =
             local_328.second.super__Function_base._M_manager;
        local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
        local_328.second._M_invoker = (_Invoker_type)0x0;
      }
    }
    else {
      pQVar39 = ppVar44[-1].first.wp.value;
      (ppVar44->first).wp.d = ppVar44[-1].first.wp.d;
      (ppVar44->first).wp.value = pQVar39;
      ppVar49[lVar46 + -1].first.wp.d = (Data *)0x0;
      ppVar49[lVar46 + -1].first.wp.value = (QObject *)0x0;
      *(undefined8 *)&(ppVar44->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) = 0;
      (ppVar44->second).super__Function_base._M_manager = (_Manager_type)0x0;
      p_Var9 = ppVar44[-1].second.super__Function_base._M_manager;
      (ppVar44->second)._M_invoker = ppVar44[-1].second._M_invoker;
      if (p_Var9 != (_Manager_type)0x0) {
        uVar15 = *(undefined8 *)((long)&ppVar44[-1].second.super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar44->second).super__Function_base._M_functor =
             *(undefined8 *)&ppVar44[-1].second.super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) = uVar15;
        (ppVar44->second).super__Function_base._M_manager = p_Var9;
        ppVar44[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
        ppVar44[-1].second._M_invoker = (_Invoker_type)0x0;
      }
      ppVar44 = ppVar49 + lVar46 + -1;
      while (lVar19 = lVar19 + 1, lVar19 != 0) {
        std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
        operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                   *)ppVar44,(type)(ppVar44 + -1));
        ppVar44 = ppVar44 + -1;
      }
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>::
      operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Enum2_&)>_>
                 *)(ppVar49 + lVar7),(type)&local_328);
    }
    (this_01->m_handlers).d.ptr = ppVar49;
    (this_01->m_handlers).d.size = lVar46 + 1;
    if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
      (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
    }
    QVar57.d = local_38.d;
    pPVar55 = local_1d0;
    if ((Data *)local_328.first.wp.d != (Data *)0x0) {
      LOCK();
      (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
         ((Data *)local_328.first.wp.d != (Data *)0x0)) {
        operator_delete(local_328.first.wp.d);
      }
    }
  }
  else {
    ppVar44 = (this_01->m_handlers).d.ptr;
    ppVar49 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
              ((ulong)((long)&old->size + 7U) & 0xfffffffffffffff8);
    if ((long)old->ptr - lVar7 == ((long)ppVar44 - (long)ppVar49 >> 4) * -0x5555555555555555) {
      if ((lVar7 != 0) || (ppVar49 == ppVar44)) goto LAB_0010add4;
      ppVar44[-1].first.wp.d = (Data *)pDVar38;
      ppVar44[-1].first.wp.value = (QObject *)pDVar37;
      *(undefined8 *)&ppVar44[-1].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar44[-1].second.super__Function_base._M_functor + 8) = 0;
      ppVar44[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar44[-1].second._M_invoker = (_Invoker_type)uVar15;
      if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
        *(Data **)&ppVar44[-1].second.super__Function_base._M_functor = local_2b8.d;
        *(undefined8 *)((long)&ppVar44[-1].second.super__Function_base._M_functor + 8) = 0;
        ppVar44[-1].second.super__Function_base._M_manager = (_Manager_type)local_2a8._0_8_;
        local_2a8._0_8_ = (Data *)0x0;
        local_2a8._8_8_ = (QObject *)0x0;
      }
      pppVar2 = &(this_01->m_handlers).d.ptr;
      *pppVar2 = *pppVar2 + -1;
    }
    else {
      ppVar44[lVar7].first.wp.d = (Data *)pDVar38;
      ppVar44[lVar7].first.wp.value = (QObject *)pDVar37;
      *(undefined8 *)&ppVar44[lVar7].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar44[lVar7].second.super__Function_base._M_functor + 8) = 0;
      ppVar44[lVar7].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar44[lVar7].second._M_invoker = (_Invoker_type)uVar15;
      if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
        *(Data **)&ppVar44[lVar7].second.super__Function_base._M_functor = local_2b8.d;
        *(undefined8 *)((long)&ppVar44[lVar7].second.super__Function_base._M_functor + 8) = 0;
        ppVar44[lVar7].second.super__Function_base._M_manager = (_Manager_type)local_2a8._0_8_;
        local_2a8._0_8_ = (Data *)0x0;
        local_2a8._8_8_ = (QObject *)0x0;
      }
    }
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    pqVar3 = &(this_01->m_handlers).d.size;
    *pqVar3 = *pqVar3 + 1;
  }
  if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
    (*(code *)local_2a8._0_8_)(&local_2b8,&local_2b8,3);
  }
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if ((*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) &&
       (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0)) {
      operator_delete(p.super_QPromiseBase<int>._vptr_QPromiseBase);
    }
  }
  if ((lock.q_val & 1) != 0) {
    lock.q_val = lock.q_val & 0xfffffffffffffffe;
    QReadWriteLock::unlock();
  }
  if ((Data *)local_1a8._0_8_ != (Data *)0x0) {
    (*(code *)local_1a8._0_8_)(&resolver_1,&resolver_1,3);
  }
  if (local_2f0.d != (Data *)0x0) {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lock.q_val = 0;
  lock.q_val = (quintptr)operator_new(8);
  *(Data **)lock.q_val = local_2f0.d;
  if (local_2f0.d != (Data *)0x0) {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  QReadWriteLock::lockForWrite();
  pQVar39 = (QObject *)QThread::currentThread();
  if (pQVar39 == (QObject *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
  }
  else {
    local_328.first.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar39);
  }
  local_328.second._M_invoker =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
       ::_M_invoke;
  local_328.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
       ::_M_manager;
  local_328.second.super__Function_base._M_functor._M_unused._M_object = (void *)lock.q_val;
  local_328.second.super__Function_base._M_functor._8_8_ = 0;
  local_328.first.wp.value = pQVar39;
  QtPrivate::
  QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
  ::emplace<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&pPVar55->m_catchers,(this_01->m_catchers).d.size,&local_328);
  if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
  }
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
         super___atomic_base<int>._M_i == 0) &&
       ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0)) {
      operator_delete(local_328.first.wp.d);
    }
  }
  QReadWriteLock::unlock();
  if (local_2f0.d != (Data *)0x0) {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  if (QVar57.d != (Data *)0x0) {
    LOCK();
    ((QVar57.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar57.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar57.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar57.d,0x10);
    }
  }
  if (resolver_5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_5.m_d.d == 0) && (resolver_5.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_5.m_d.d,0x10);
    }
  }
  bVar28 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
           ::isPending(this_01);
  if (!bVar28) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>::
    dispatch(this_01);
  }
  bVar28 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar33);
  while (bVar28 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar28 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar33);
  }
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar33->_vptr_PromiseDataBase[1])(pPVar33);
  }
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar33->_vptr_PromiseDataBase[1])(pPVar33);
  }
  iVar29 = (int)local_1e8.d.d;
  QByteArray::number(iVar48,(int)local_1e8.d.d);
  pQVar39 = local_328.first.wp.value;
  if (local_328.first.wp.value == (QObject *)0x0) {
    pQVar39 = (QObject *)&QByteArray::_empty;
  }
  pcVar34 = (char *)qstrdup((char *)pQVar39);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  QByteArray::number(iVar48,1);
  pQVar39 = local_328.first.wp.value;
  if (local_328.first.wp.value == (QObject *)0x0) {
    pQVar39 = (QObject *)&QByteArray::_empty;
  }
  pcVar35 = (char *)qstrdup((char *)pQVar39);
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  cVar27 = QTest::compare_helper
                     (iVar29 == 1,"Compared values are not the same",pcVar34,pcVar35,
                      "waitForValue(p, Enum2::Value0)","Enum2::Value1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,0x6d);
  if (cVar27 == '\0') {
    cVar27 = '\0';
  }
  else {
    bVar28 = QtPromisePrivate::
             PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
             ::isPending(this_01);
    cVar27 = QTest::qVerify((bool)(~bVar28 &
                                  (this_01->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x6e);
  }
  LOCK();
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  if (cVar27 == '\0') {
    return;
  }
  QByteArray::QByteArray((QByteArray *)&local_328,"foo",-1);
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f110;
  pPVar30 = (PromiseData<(anonymous_namespace)::Enum1> *)operator_new(0x68);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->super_QSharedData = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_lock = 0;
  *(undefined8 *)
   &((PromiseDataBase<int,_void_(const_int_&)> *)
    &pPVar30->
     super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
    )->m_settled = 0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f648;
  QReadWriteLock::QReadWriteLock
            (&((PromiseDataBase<int,_void_(const_int_&)> *)
              &pPVar30->
               super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
              )->m_lock,0);
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->m_settled = false;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_handlers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.d = (Data *)0x0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_catchers).d.size = 0;
  (((PromiseDataBase<int,_void_(const_int_&)> *)
   &pPVar30->
    super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
   )->m_error).m_data._M_exception_object = (void *)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)
  &pPVar30->
   super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>)
  ->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014f5e0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar30->m_value).m_data.
  super___shared_ptr<(anonymous_namespace)::Enum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
             &pPVar30->
              super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
             )->super_QSharedData;
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar30 != (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)
               &pPVar30->
                super_PromiseDataBase<(anonymous_namespace)::Enum1,_void_(const_(anonymous_namespace)::Enum1_&)>
               )->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014f5a8;
  local_2e8._8_8_ = pPVar30;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)pPVar30;
  QtPromisePrivate::PromiseResolver<QByteArray>::PromiseResolver
            ((PromiseResolver<QByteArray> *)&resolver_2,(QPromise<QByteArray> *)&p);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014f110;
  if (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar32 = &((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar24.m_d.d = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)resolver_2.m_d.d
  ;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseResolver<QByteArray>::resolve<QByteArray>
            ((PromiseResolver<QByteArray> *)&resolver_5,(QByteArray *)&local_328);
  if (PVar24.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar24.m_d.d = *(int *)PVar24.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar24.m_d.d == 0) {
      operator_delete((void *)PVar24.m_d.d,0x10);
    }
  }
  if (resolver_5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_5.m_d.d == 0) && (resolver_5.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_5.m_d.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f5a8;
  QtPromise::QPromise<QByteArray>::convert<QString>((QPromise<QByteArray> *)&resolver);
  local_2e8._0_8_ = &PTR__QPromiseBase_0014f110;
  if ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0) {
    LOCK();
    pQVar32 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
        (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
      (*((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->_vptr_PromiseDataBase[1])();
    }
  }
  if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
    _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_328.first.wp.d,1,8);
    }
  }
  local_2e8._0_8_ = (QArrayData *)0x0;
  local_2e8._8_8_ = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2d8._0_8_ = (Data *)0x0;
  waitForValue<QString>((QString *)&p,(QPromise<QString> *)&resolver,(QString *)local_2e8);
  QVar61.m_data = (storage_type *)0x3;
  QVar61.m_size = (qsizetype)&local_328;
  QString::fromUtf8(QVar61);
  pDVar13 = local_328.first.wp.d;
  QVar62.m_data = (storage_type_conflict *)p.super_QPromiseBase<int>.m_d.d;
  QVar62.m_size = (qsizetype)local_2b8.d;
  QVar65.m_data = (storage_type_conflict *)local_328.first.wp.value;
  QVar65.m_size = local_328.second.super__Function_base._M_functor._M_unused._0_8_;
  cVar27 = QTest::qCompare(QVar62,QVar65,"waitForValue(p, QString{})","QString{\"foo\"}",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x78);
  if ((QArrayData *)pDVar13 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&pDVar13->field_0x0)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&pDVar13->field_0x0)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&pDVar13->field_0x0)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pDVar13,2,8);
    }
  }
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
      QArrayData::deallocate((QArrayData *)p.super_QPromiseBase<int>._vptr_QPromiseBase,2,8);
    }
  }
  if ((QArrayData *)local_2e8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,8);
    }
  }
  if (cVar27 == '\0') {
    cVar27 = '\0';
  }
  else {
    bVar28 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                       ((PromiseDataBase<QString,_void_(const_QString_&)> *)pPVar33);
    cVar27 = QTest::qVerify((bool)(~bVar28 &
                                  (pPVar33->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x79);
  }
  local_1d0 = (PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
               *)&PTR__QPromiseBase_0014f140;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       &PTR__QPromiseBase_0014f140;
  if (pPVar33 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar32 = &pPVar33->super_QSharedData;
    (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPVar33 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*pPVar33->_vptr_PromiseDataBase[1])();
    }
  }
  if (cVar27 == '\0') {
    return;
  }
  local_1e8.d.d = (Data *)CONCAT44(local_1e8.d.d._4_4_,0x2a);
  QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)local_2e8,(Foo *)&local_1e8);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                std::
                _Function_handler<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                ::_M_invoke;
  local_2b8.d = (Data *)std::
                        _Function_handler<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:569:16)>
                        ::_M_manager;
  this_02 = (PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
             *)operator_new(0x68);
  this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_02->super_QSharedData = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&this_02->m_lock = 0;
  *(undefined8 *)&this_02->m_settled = 0;
  *(undefined8 *)&this_02[1].super_QSharedData = 0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014ed08;
  QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
  this_02->m_settled = false;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014eca0;
  this_02[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_02[1].super_QSharedData = 0;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar32 = &this_02->super_QSharedData;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver_5.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x10);
  (((Data *)resolver_5.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
  ((Data *)resolver_5.m_d.d)->promise = (QPromise<void> *)0x0;
  LOCK();
  (((Data *)resolver_5.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((Data *)resolver_5.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  puVar36 = (undefined8 *)operator_new(0x10);
  PVar23.m_d.d = resolver_5.m_d.d;
  uVar15 = local_2e8._8_8_;
  puVar36[1] = this_02;
  *puVar36 = &PTR__QPromiseBase_0014ec68;
  *(undefined8 **)((long)resolver_5.m_d.d + 8) = puVar36;
  if (resolver_5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.d = (Data *)resolver_5.m_d.d;
  if (resolver_5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
  }
  local_328.first.wp.value = (QObject *)resolver_5.m_d.d;
  if (resolver_5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)
             &local_328.second,
             (function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)&p);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)(Data *)0x0;
  QVar40.d = (Data *)operator_new(0x30);
  *(Data **)QVar40.d = local_328.first.wp.d;
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (QVar40.d)->promise = (QPromise<double> *)local_328.first.wp.value;
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  std::function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)>::function
            ((function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)
             (QVar40.d + 1),
             (function<(anonymous_namespace)::Bar_(const_(anonymous_namespace)::Foo_&)> *)
             &local_328.second);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<double>::Data>)QVar40.d;
  if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
  }
  if ((Data *)local_328.first.wp.value != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.value)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.value != (Data *)0x0)) {
      operator_delete(local_328.first.wp.value,0x10);
    }
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.d != (Data *)0x0)) {
      operator_delete(local_328.first.wp.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addHandler
            ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              *)uVar15,(function<void_(const_(anonymous_namespace)::Foo_&)> *)&resolver);
  std::
  _Function_handler<void_(const_(anonymous_namespace)::Foo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  uVar15 = local_2e8._8_8_;
  if (PVar23.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )(Data *)0x0;
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum1>::Data>
        )operator_new(8);
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)resolver_2.m_d.d =
       PVar23.m_d.d;
  if (PVar23.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar23.m_d.d == 0) {
      operator_delete((void *)PVar23.m_d.d,0x10);
    }
  }
  QtPromisePrivate::
  PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addCatcher
            ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
              *)uVar15,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver_2);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
  ::_M_manager((_Any_data *)&resolver_2,(_Any_data *)&resolver_2,__destroy_functor);
  if (PVar23.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar23.m_d.d == 0) {
      operator_delete((void *)PVar23.m_d.d,0x10);
    }
  }
  if (PVar23.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar23.m_d.d == 0) {
      operator_delete((void *)PVar23.m_d.d,0x10);
    }
  }
  if (resolver_5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_5.m_d.d == 0) && (resolver_5.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_5.m_d.d,0x10);
    }
  }
  uVar15 = local_2e8._8_8_;
  bVar28 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::
           isPending((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                      *)local_2e8._8_8_);
  if (!bVar28) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::dispatch
              ((PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
                *)uVar15);
  }
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  local_2e8._0_8_ = &PTR__QPromiseBase_0014e340;
  LOCK();
  pQVar54 = &((PromiseDataBase<int,_void_(const_int_&)> *)uVar15)->super_QSharedData;
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     ((PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_ !=
      (PromiseData<(anonymous_namespace)::Enum1> *)0x0)) {
    (*((PromiseDataBase<int,_void_(const_int_&)> *)local_2e8._8_8_)->_vptr_PromiseDataBase[1])();
  }
  local_1a8._28_4_ = -1;
  pPVar33 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar33->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar33->super_QSharedData = 0;
  (pPVar33->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar33->m_catchers).d.size = 0;
  (pPVar33->m_handlers).d.size = 0;
  (pPVar33->m_catchers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  *(undefined8 *)&pPVar33->m_lock = 0;
  *(undefined8 *)&pPVar33->m_settled = 0;
  (pPVar33->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar33->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f570;
  QReadWriteLock::QReadWriteLock(&pPVar33->m_lock,0);
  pPVar33->m_settled = false;
  (pPVar33->m_handlers).d.d = (Data *)0x0;
  (pPVar33->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)0x0;
  (pPVar33->m_handlers).d.size = 0;
  (pPVar33->m_catchers).d.d = (Data *)0x0;
  (pPVar33->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar33->m_catchers).d.size = 0;
  (pPVar33->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar33->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014f508;
  LOCK();
  (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar54 = &pPVar33->super_QSharedData;
  LOCK();
  (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (pPVar33->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_1e8.d.d = (Data *)local_50.d;
  local_1e8.d.ptr = (char16_t *)pPVar33;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_8,(QPromise<void> *)&local_1e8)
  ;
  local_1e8.d.d = (Data *)&PTR__QPromiseBase_0014f170;
  if ((PromiseDataBase<void,_void_()> *)local_1e8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)((long)local_1e8.d.ptr + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int> == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_1e8.d.ptr != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*(*(_func_int ***)local_1e8.d.ptr)[1])();
    }
  }
  PVar23.m_d.d = resolver_8.m_d.d;
  if (resolver_8.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
  }
  local_2f0.d = (Data *)resolver_8.m_d.d;
  if (resolver_8.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + 1;
    UNLOCK();
  }
  local_2d8._0_8_ = (Data *)0x0;
  local_2d8._8_8_ = (QObject *)0x0;
  local_2e8._0_8_ = (Data *)0x0;
  local_2e8._8_8_ = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2e8._0_8_ = operator_new(0x18);
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
   &((Data *)local_2e8._0_8_)->super_QSharedData = PVar23.m_d.d;
  if (PVar23.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + 1;
    UNLOCK();
  }
  ((Data *)local_2e8._0_8_)->promise = (QPromise<int> *)local_2f0.d;
  if (local_2f0.d == (Data *)0x0) {
    *(undefined1 **)&((Data *)(local_2e8._0_8_ + 0x10))->super_QSharedData = local_1a8 + 0x1c;
    local_2d8._8_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_2d8._0_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
  }
  else {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined1 **)&((Data *)(local_2e8._0_8_ + 0x10))->super_QSharedData = local_1a8 + 0x1c;
    local_2d8._8_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_2d8._0_8_ =
         std::
         _Function_handler<void_(const_(anonymous_namespace)::Bar_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  if (PVar23.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar23.m_d.d == 0) {
      operator_delete((void *)PVar23.m_d.d,0x10);
    }
  }
  QReadWriteLock::lockForWrite();
  auVar58 = QThread::currentThread();
  pDVar41 = auVar58._0_8_;
  if (pDVar41 == (Data *)0x0) {
    auVar60._8_8_ = 0;
    auVar60._0_8_ = auVar58._8_8_;
    auVar60 = auVar60 << 0x40;
  }
  else {
    auVar60 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar41);
  }
  uVar15 = local_2d8._8_8_;
  ppVar44 = auVar60._8_8_;
  pDVar42 = auVar60._0_8_;
  local_2b8.d = (Data *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  local_2a8._0_8_ = (Data *)0x0;
  local_2a8._8_8_ = local_2d8._8_8_;
  if ((Data *)local_2d8._0_8_ != (Data *)0x0) {
    ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)local_2d8;
    local_2b8.d = (Data *)local_2e8._0_8_;
    pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)local_2e8._8_8_;
    local_2a8._0_8_ = local_2d8._0_8_;
    local_2d8._0_8_ = (Data *)0x0;
    local_2d8._8_8_ = (QObject *)0x0;
  }
  old_00 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
            *)(this_02->m_handlers).d.d;
  lVar7 = (this_02->m_handlers).d.size;
  if ((old_00 != (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                  *)0x0) &&
     (uVar6 = (((QArrayData *)&old_00->d)->ref_)._q_value.super___atomic_base<int>._M_i,
     ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)(ulong)uVar6,
     (int)uVar6 < 2)) {
    ppVar44 = (this_02->m_handlers).d.ptr;
    ppVar49 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
              ((ulong)((long)&old_00->size + 7U) & 0xfffffffffffffff8);
    if ((long)old_00->ptr - lVar7 == ((long)ppVar44 - (long)ppVar49 >> 4) * -0x5555555555555555) {
      if ((lVar7 != 0) || (ppVar49 == ppVar44)) goto LAB_0010bec8;
      ppVar44[-1].first.wp.d = (Data *)pDVar42;
      ppVar44[-1].first.wp.value = (QObject *)pDVar41;
      *(undefined8 *)&ppVar44[-1].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar44[-1].second.super__Function_base._M_functor + 8) = 0;
      ppVar44[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar44[-1].second._M_invoker = (_Invoker_type)uVar15;
      if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
        *(Data **)&ppVar44[-1].second.super__Function_base._M_functor = local_2b8.d;
        *(PromiseData<(anonymous_namespace)::Enum1> **)
         ((long)&ppVar44[-1].second.super__Function_base._M_functor + 8) = pPStack_2b0;
        ppVar44[-1].second.super__Function_base._M_manager = (_Manager_type)local_2a8._0_8_;
        local_2a8._0_8_ = (Data *)0x0;
        local_2a8._8_8_ = (QObject *)0x0;
      }
      pppVar2 = &(this_02->m_handlers).d.ptr;
      *pppVar2 = *pppVar2 + -1;
    }
    else {
      ppVar44[lVar7].first.wp.d = (Data *)pDVar42;
      ppVar44[lVar7].first.wp.value = (QObject *)pDVar41;
      *(undefined8 *)&ppVar44[lVar7].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar44[lVar7].second.super__Function_base._M_functor + 8) = 0;
      ppVar44[lVar7].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar44[lVar7].second._M_invoker = (_Invoker_type)uVar15;
      if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
        *(Data **)&ppVar44[lVar7].second.super__Function_base._M_functor = local_2b8.d;
        *(PromiseData<(anonymous_namespace)::Enum1> **)
         ((long)&ppVar44[lVar7].second.super__Function_base._M_functor + 8) = pPStack_2b0;
        ppVar44[lVar7].second.super__Function_base._M_manager = (_Manager_type)local_2a8._0_8_;
        local_2a8._0_8_ = (Data *)0x0;
        local_2a8._8_8_ = (QObject *)0x0;
      }
    }
    p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
    p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    pqVar3 = &(this_02->m_handlers).d.size;
    *pqVar3 = *pqVar3 + 1;
    goto LAB_0010c39e;
  }
LAB_0010bec8:
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  local_328.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_328.second.super__Function_base._M_functor._8_8_ = 0;
  local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
  local_328.second._M_invoker = (_Invoker_type)uVar15;
  if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
    ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)local_2a8;
    local_328.second.super__Function_base._M_functor._M_unused._M_object = local_2b8.d;
    local_328.second.super__Function_base._M_functor._8_8_ = pPStack_2b0;
    local_328.second.super__Function_base._M_manager = (_Manager_type)local_2a8._0_8_;
    local_2a8._0_8_ = (Data *)0x0;
    local_2a8._8_8_ = (QObject *)0x0;
  }
  local_328.first.wp.d = (Data *)pDVar42;
  local_328.first.wp.value = (QObject *)pDVar41;
  if ((old_00 == (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                  *)0x0) ||
     (1 < (((QArrayData *)&old_00->d)->ref_)._q_value.super___atomic_base<int>._M_i)) {
LAB_0010bf26:
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
    ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
                         *)&this_02->m_handlers,GrowsAtEnd,(qsizetype)ppVar44,old_00);
  }
  else {
    ppVar11 = old_00->ptr;
    ppVar43 = (type)(this_02->m_handlers).d.ptr;
    ppVar44 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
              ((long)ppVar43 - ((ulong)((long)&old_00->size + 7) & 0xfffffffffffffff8));
    lVar46 = (long)ppVar44 >> 4;
    old_00 = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>_>
              *)(lVar46 * 0x5555555555555555);
    if (((long)ppVar11 - lVar7) + (long)old_00 < 1) {
      if (((long)ppVar44 < 1) ||
         (SBORROW8(lVar7 * 3,(long)ppVar11 * 2) == lVar7 * 3 + (long)ppVar11 * -2 < 0))
      goto LAB_0010bf26;
      ppVar4 = (type)((long)ppVar43 + lVar46 * -0x10);
      if (ppVar43 != (type)0x0 && lVar7 != 0) {
        ppVar56 = ppVar4 + lVar7;
        ppVar52 = ppVar43;
        ppVar18 = ppVar56;
        if (ppVar43 < ppVar56) {
          ppVar52 = ppVar56;
          ppVar18 = ppVar43;
        }
        p_3.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)ppVar4;
        if (ppVar18 != ppVar4) {
          lVar19 = lVar46 * -0x10;
          do {
            (((type)((long)ppVar43 + lVar19))->first).wp.d = (ppVar43->first).wp.d;
            *(QObject **)((long)ppVar43 + lVar19 + 8) = (ppVar43->first).wp.value;
            (ppVar43->first).wp.d = (Data *)0x0;
            (ppVar43->first).wp.value = (QObject *)0x0;
            puVar36 = (undefined8 *)((long)ppVar43 + lVar19 + 0x10);
            *puVar36 = 0;
            puVar36[1] = 0;
            *(undefined8 *)((long)ppVar43 + lVar19 + 0x20) = 0;
            *(_Invoker_type *)((long)ppVar43 + lVar19 + 0x28) = (ppVar43->second)._M_invoker;
            if ((ppVar43->second).super__Function_base._M_manager != (_Manager_type)0x0) {
              uVar15 = *(undefined8 *)((long)&(ppVar43->second).super__Function_base._M_functor + 8)
              ;
              *(undefined8 *)((long)ppVar43 + lVar19 + 0x10) =
                   *(undefined8 *)&(ppVar43->second).super__Function_base._M_functor;
              *(undefined8 *)((long)ppVar43 + lVar19 + 0x18) = uVar15;
              *(_Manager_type *)((long)ppVar43 + lVar19 + 0x20) =
                   (ppVar43->second).super__Function_base._M_manager;
              (ppVar43->second).super__Function_base._M_manager = (_Manager_type)0x0;
              (ppVar43->second)._M_invoker = (_Invoker_type)0x0;
            }
            ppVar47 = (type)((long)ppVar43 + lVar19 + 0x30);
            ppVar43 = ppVar43 + 1;
          } while (ppVar47 != ppVar18);
          p_3.super_QPromiseBase<QString>._vptr_QPromiseBase =
               (_func_int **)(lVar46 * -0x10 + (long)ppVar43);
        }
        resolver_5.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)local_258;
        local_258[0] = p_3.super_QPromiseBase<QString>._vptr_QPromiseBase;
        ppStack_260 = ppVar4;
        for (; (type)p_3.super_QPromiseBase<QString>._vptr_QPromiseBase != ppVar56;
            p_3.super_QPromiseBase<QString>._vptr_QPromiseBase =
                 p_3.super_QPromiseBase<QString>._vptr_QPromiseBase + 6) {
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
          operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>
                     *)p_3.super_QPromiseBase<QString>._vptr_QPromiseBase,ppVar43);
          ppVar43 = ppVar43 + 1;
        }
        resolver_5.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             &ppStack_260;
        while (ppVar43 != ppVar52) {
          p_Var9 = ppVar43[-1].second.super__Function_base._M_manager;
          if (p_Var9 != (_Manager_type)0x0) {
            (*p_Var9)((_Any_data *)&ppVar43[-1].second,(_Any_data *)&ppVar43[-1].second,
                      __destroy_functor);
          }
          ppVar43 = ppVar43 + -1;
          pDVar13 = (ppVar43->first).wp.d;
          if (pDVar13 != (Data *)0x0) {
            LOCK();
            *(int *)pDVar13 = *(int *)pDVar13 + -1;
            UNLOCK();
            if ((*(int *)pDVar13 == 0) && (pDVar13 = (ppVar43->first).wp.d, pDVar13 != (Data *)0x0))
            {
              operator_delete(pDVar13);
            }
          }
        }
        ppVar43 = *(type *)resolver_5.m_d.d;
        if (ppVar43 != ppStack_260) {
          bVar28 = ppVar43 < ppStack_260;
          do {
            *(type *)resolver_5.m_d.d = ppVar43 + ((ulong)bVar28 - 1 | 1);
            puVar36 = *(undefined8 **)resolver_5.m_d.d;
            if ((code *)puVar36[4] != (code *)0x0) {
              (*(code *)puVar36[4])(puVar36 + 2,puVar36 + 2,3);
            }
            piVar14 = (int *)*puVar36;
            if (piVar14 != (int *)0x0) {
              LOCK();
              *piVar14 = *piVar14 + -1;
              UNLOCK();
              if ((*piVar14 == 0) && ((void *)*puVar36 != (void *)0x0)) {
                operator_delete((void *)*puVar36);
              }
            }
            ppVar43 = *(type *)resolver_5.m_d.d;
          } while (ppVar43 != ppStack_260);
        }
      }
      (this_02->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)ppVar4;
    }
  }
  ppVar49 = (this_02->m_handlers).d.ptr;
  lVar46 = (this_02->m_handlers).d.size;
  ppVar44 = ppVar49 + lVar46;
  lVar19 = -(lVar46 - lVar7);
  if (lVar46 - lVar7 < 1) {
    (ppVar44->first).wp.d = local_328.first.wp.d;
    (ppVar44->first).wp.value = local_328.first.wp.value;
    local_328.first.wp.d = (Data *)0x0;
    local_328.first.wp.value = (QObject *)0x0;
    *(undefined8 *)&(ppVar44->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) = 0;
    (ppVar44->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar44->second)._M_invoker = (_Invoker_type)local_328.second._M_invoker;
    if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
      *(void **)&(ppVar44->second).super__Function_base._M_functor =
           local_328.second.super__Function_base._M_functor._M_unused._M_object;
      *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) =
           local_328.second.super__Function_base._M_functor._8_8_;
      (ppVar44->second).super__Function_base._M_manager =
           local_328.second.super__Function_base._M_manager;
      local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
      local_328.second._M_invoker = (_Invoker_type)0x0;
    }
  }
  else {
    pQVar39 = ppVar44[-1].first.wp.value;
    (ppVar44->first).wp.d = ppVar44[-1].first.wp.d;
    (ppVar44->first).wp.value = pQVar39;
    (((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
     (ppVar49 + lVar46 + -1))->first).wp.d = (Data *)0x0;
    ppVar49[lVar46 + -1].first.wp.value = (QObject *)0x0;
    *(undefined8 *)&(ppVar44->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) = 0;
    (ppVar44->second).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Var9 = ppVar44[-1].second.super__Function_base._M_manager;
    (ppVar44->second)._M_invoker = ppVar44[-1].second._M_invoker;
    if (p_Var9 != (_Manager_type)0x0) {
      uVar15 = *(undefined8 *)((long)&ppVar44[-1].second.super__Function_base._M_functor + 8);
      *(undefined8 *)&(ppVar44->second).super__Function_base._M_functor =
           *(undefined8 *)&ppVar44[-1].second.super__Function_base._M_functor;
      *(undefined8 *)((long)&(ppVar44->second).super__Function_base._M_functor + 8) = uVar15;
      (ppVar44->second).super__Function_base._M_manager = p_Var9;
      ppVar44[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar44[-1].second._M_invoker = (_Invoker_type)0x0;
    }
    ppVar11 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
              (ppVar49 + lVar46 + -1);
    while (lVar19 = lVar19 + 1, lVar19 != 0) {
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
      operator=(ppVar11,ppVar11 + -1);
      ppVar11 = ppVar11 + -1;
    }
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_>::
    operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Bar_&)>_> *)
              (ppVar49 + lVar7),(type)&local_328);
  }
  (this_02->m_handlers).d.ptr = ppVar49;
  (this_02->m_handlers).d.size = lVar46 + 1;
  if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
    (*local_328.second.super__Function_base._M_manager)(&local_328.second,&local_328.second,3);
  }
  if ((Data *)local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_328.first.wp.d)->field_0x0)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_328.first.wp.d != (Data *)0x0)) {
      operator_delete(local_328.first.wp.d);
    }
  }
LAB_0010c39e:
  if ((Data *)local_2a8._0_8_ != (Data *)0x0) {
    (*(code *)local_2a8._0_8_)(&local_2b8,&local_2b8,3);
  }
  if (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if ((*(int *)p.super_QPromiseBase<int>._vptr_QPromiseBase == 0) &&
       (p.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0)) {
      operator_delete(p.super_QPromiseBase<int>._vptr_QPromiseBase);
    }
  }
  QReadWriteLock::unlock();
  if ((Data *)local_2d8._0_8_ != (Data *)0x0) {
    (*(code *)local_2d8._0_8_)(local_2e8,local_2e8,3);
  }
  if (local_2f0.d != (Data *)0x0) {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2b8.d = (Data *)0x0;
  pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)operator_new(8);
  *p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int *)local_2f0.d;
  if (local_2f0.d == (Data *)0x0) {
    pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                  std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_2b8.d = (Data *)std::
                          _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                          ::_M_manager;
  }
  else {
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)
                  std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                  ::_M_invoke;
    local_2b8.d = (Data *)std::
                          _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:372:16)>
                          ::_M_manager;
    LOCK();
    ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_2f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_2f0.d,0x10);
    }
  }
  QReadWriteLock::lockForWrite();
  pQVar39 = (QObject *)QThread::currentThread();
  if (pQVar39 == (QObject *)0x0) {
    local_328.first.wp.d = (Data *)0x0;
  }
  else {
    local_328.first.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar39);
  }
  local_328.second.super__Function_base._M_functor._M_unused._M_object = (_func_int **)0x0;
  local_328.second.super__Function_base._M_functor._8_8_ = (PromiseData<int> *)0x0;
  local_328.second.super__Function_base._M_manager = (_Manager_type)0x0;
  local_328.second._M_invoker = (_Invoker_type)pPStack_2b0;
  if (local_2b8.d != (Data *)0x0) {
    local_328.second.super__Function_base._M_functor._M_unused._M_object =
         p.super_QPromiseBase<int>._vptr_QPromiseBase;
    local_328.second.super__Function_base._M_functor._8_8_ = p.super_QPromiseBase<int>.m_d.d;
    local_328.second.super__Function_base._M_manager = (_Manager_type)local_2b8.d;
    local_2b8.d = (Data *)0x0;
    pPStack_2b0 = (PromiseData<(anonymous_namespace)::Enum1> *)0x0;
  }
  local_328.first.wp.value = pQVar39;
  QtPrivate::
  QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
  ::emplace<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
            ((QGenericArrayOps<std::pair<QPointer<QThread>,std::function<void(QtPromisePrivate::PromiseError_const&)>>>
              *)&this_02->m_catchers,(this_02->m_catchers).d.size,&local_328);
  QVar50.d = local_2f0.d;
  if ((Data *)local_328.second.super__Function_base._M_manager != (Data *)0x0) {
    (*local_328.second.super__Function_base._M_manager)
              ((_Any_data *)&local_328.second,(_Any_data *)&local_328.second,__destroy_functor);
  }
  if (local_328.first.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)local_328.first.wp.d = *(int *)local_328.first.wp.d + -1;
    UNLOCK();
    if ((*(int *)local_328.first.wp.d == 0) && (local_328.first.wp.d != (Data *)0x0)) {
      operator_delete(local_328.first.wp.d);
    }
  }
  QReadWriteLock::unlock();
  if (local_2b8.d != (Data *)0x0) {
    (*(code *)local_2b8.d)((_Any_data *)&p,(_Any_data *)&p,__destroy_functor);
  }
  if (QVar50.d != (Data *)0x0) {
    LOCK();
    ((QVar50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar50.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar50.d,0x10);
    }
  }
  if (PVar23.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar23.m_d.d = *(int *)PVar23.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar23.m_d.d == 0) {
      operator_delete((void *)PVar23.m_d.d,0x10);
    }
  }
  if (resolver_8.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_8.m_d.d = *(int *)resolver_8.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_8.m_d.d == 0) && (resolver_8.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_8.m_d.d,0x10);
    }
  }
  bVar28 = QtPromisePrivate::
           PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>::
           isPending(this_02);
  if (!bVar28) {
    QtPromisePrivate::
    PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>::dispatch
              (this_02);
  }
  bVar28 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar33);
  while (bVar28 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar28 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar33);
  }
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar33->_vptr_PromiseDataBase[1])(pPVar33);
  }
  LOCK();
  (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar54->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar33->_vptr_PromiseDataBase[1])(pPVar33);
  }
  cVar27 = QTest::compare_helper
                     (local_1a8._28_4_ == 0x2a,"Compared values are not the same",(char *)0x0,
                      (char *)0x0,"waitForValue(p, Bar{})","Bar{42}",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                      ,0x83);
  if (cVar27 == '\0') {
    cVar27 = '\0';
  }
  else {
    bVar28 = QtPromisePrivate::
             PromiseDataBase<(anonymous_namespace)::Bar,_void_(const_(anonymous_namespace)::Bar_&)>
             ::isPending(this_02);
    cVar27 = QTest::qVerify((bool)(~bVar28 &
                                  (this_02->m_error).m_data._M_exception_object == (void *)0x0),
                            "p.isFulfilled()","",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x84);
  }
  LOCK();
  (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  if (cVar27 != '\0') {
    resolver_5.m_d.d._0_4_ = 0x2a;
    QtPromise::resolve<int>((QtPromise *)&local_328,(int *)&resolver_5);
    QtPromise::QPromise<int>::convert<QString>((QPromise<int> *)&p_3);
    local_328.first.wp.d = (Data *)&PTR__QPromiseBase_0014f0e0;
    if (local_328.first.wp.value != (QObject *)0x0) {
      LOCK();
      pQVar39 = local_328.first.wp.value + 8;
      *(int *)pQVar39 = *(int *)pQVar39 + -1;
      UNLOCK();
      if ((*(int *)pQVar39 == 0) && (local_328.first.wp.value != (QObject *)0x0)) {
        (**(code **)(*(long *)&(local_328.first.wp.value)->field_0x0 + 8))();
      }
    }
    resolver_5.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
    ppStack_260 = (type)0x0;
    local_258[0] = (_func_int **)0x0;
    waitForValue<QString>((QString *)&local_328,&p_3,(QString *)&resolver_5);
    QString::QString(&local_1e8,"42");
    QVar63.m_data = (storage_type_conflict *)local_328.first.wp.value;
    QVar63.m_size = local_328.second.super__Function_base._M_functor._M_unused._0_8_;
    QVar66.m_data = local_1e8.d.ptr;
    QVar66.m_size = local_1e8.d.size;
    cVar27 = QTest::qCompare(QVar63,QVar66,"waitForValue(p, QString{})","QString{\"42\"}",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                             ,0x8d);
    if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,8);
      }
    }
    if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_328.first.wp.d,2,8);
      }
    }
    if (resolver_5.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + -1;
      UNLOCK();
      if (*(int *)resolver_5.m_d.d == 0) {
        QArrayData::deallocate((QArrayData *)resolver_5.m_d.d,2,8);
      }
    }
    QVar25.d = p_3.super_QPromiseBase<QString>.m_d.d;
    if (cVar27 == '\0') {
      cVar27 = '\0';
    }
    else {
      bVar28 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                         (&(p_3.super_QPromiseBase<QString>.m_d.d)->
                           super_PromiseDataBase<QString,_void_(const_QString_&)>);
      cVar27 = QTest::qVerify((bool)(~bVar28 &
                                    ((QVar25.d)->
                                    super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.
                                    m_data._M_exception_object == (void *)0x0),"p.isFulfilled()","",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                              ,0x8e);
    }
    p_3.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)local_1d0;
    if (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar32 = &((p_3.super_QPromiseBase<QString>.m_d.d)->
                 super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0)) {
        (*((p_3.super_QPromiseBase<QString>.m_d.d)->
          super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase[1])();
      }
    }
    if (cVar27 != '\0') {
      resolver_5.m_d.d._0_4_ = 0x2a;
      QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_328,(Foo *)&resolver_5);
      QtPromise::QPromise<(anonymous_namespace)::Foo>::convert<QString>
                ((QPromise<(anonymous_namespace)::Foo> *)&p_3);
      local_328.first.wp.d = (Data *)&PTR__QPromiseBase_0014e340;
      if (local_328.first.wp.value != (QObject *)0x0) {
        LOCK();
        pQVar39 = local_328.first.wp.value + 8;
        *(int *)pQVar39 = *(int *)pQVar39 + -1;
        UNLOCK();
        if ((*(int *)pQVar39 == 0) && (local_328.first.wp.value != (QObject *)0x0)) {
          (**(code **)(*(long *)&(local_328.first.wp.value)->field_0x0 + 8))();
        }
      }
      resolver_5.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
      ppStack_260 = (type)0x0;
      local_258[0] = (_func_int **)0x0;
      waitForValue<QString>((QString *)&local_328,&p_3,(QString *)&resolver_5);
      QString::QString(&local_1e8,"Foo{42}");
      QVar64.m_data = (storage_type_conflict *)local_328.first.wp.value;
      QVar64.m_size = local_328.second.super__Function_base._M_functor._M_unused._0_8_;
      QVar67.m_data = local_1e8.d.ptr;
      QVar67.m_size = local_1e8.d.size;
      cVar27 = QTest::qCompare(QVar64,QVar67,"waitForValue(p, QString{})","QString{\"Foo{42}\"}",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                               ,0x98);
      if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,8);
        }
      }
      if ((QArrayData *)local_328.first.wp.d != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).super___atomic_base<int>
        ._M_i = (((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
                super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_328.first.wp.d)->field_0x0)->_q_value).
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_328.first.wp.d,2,8);
        }
      }
      if (resolver_5.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_5.m_d.d = *(int *)resolver_5.m_d.d + -1;
        UNLOCK();
        if (*(int *)resolver_5.m_d.d == 0) {
          QArrayData::deallocate((QArrayData *)resolver_5.m_d.d,2,8);
        }
      }
      QVar25.d = p_3.super_QPromiseBase<QString>.m_d.d;
      if (cVar27 != '\0') {
        bVar28 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                           (&(p_3.super_QPromiseBase<QString>.m_d.d)->
                             super_PromiseDataBase<QString,_void_(const_QString_&)>);
        QTest::qVerify((bool)(~bVar28 &
                             ((QVar25.d)->super_PromiseDataBase<QString,_void_(const_QString_&)>).
                             m_error.m_data._M_exception_object == (void *)0x0),"p.isFulfilled()",""
                       ,
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                       ,0x99);
      }
      p_3.super_QPromiseBase<QString>._vptr_QPromiseBase = (_func_int **)local_1d0;
      if (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0) {
        LOCK();
        pQVar32 = &((p_3.super_QPromiseBase<QString>.m_d.d)->
                   super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
        (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar32->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (p_3.super_QPromiseBase<QString>.m_d.d != (PromiseData<QString> *)0x0)) {
          (*((p_3.super_QPromiseBase<QString>.m_d.d)->
            super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase[1])();
        }
      }
    }
  }
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsU()
{
    // Static cast between primitive types.
    {
        auto p = QtPromise::resolve(42.13).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 42);
        QVERIFY(p.isFulfilled());
    }

    // Convert enum class to int.
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 1);
        QVERIFY(p.isFulfilled());
    }

    // Convert int to enum class.
    {
        auto p = QtPromise::resolve(1).convert<Enum1>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum1>>::value));

        QCOMPARE(waitForValue(p, Enum1::Value0), Enum1::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Convert between enums
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<Enum2>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum2>>::value));

        QCOMPARE(waitForValue(p, Enum2::Value0), Enum2::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(QByteArray{"foo"}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"foo"});
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for non-Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(Foo{42}).convert<Bar>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Bar>>::value));

        QCOMPARE(waitForValue(p, Bar{}), Bar{42});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of types Qt is aware of via QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"42"});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of a non-Qt type via QVariant.
    // https://doc.qt.io/qt-5/qmetatype.html#registerConverter
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"Foo{42}"});
        QVERIFY(p.isFulfilled());
    }
}